

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray * __thiscall QByteArray::assign(QByteArray *this,QByteArrayView v)

{
  Data *pDVar1;
  qsizetype qVar2;
  char *pcVar3;
  size_t __n;
  char *pcVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  QByteArrayView local_28;
  long local_18;
  
  local_28.m_data = v.m_data;
  __n = v.m_size;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->d).d;
  local_28.m_size = __n;
  if (((pDVar1 == (Data *)0x0) || ((pDVar1->super_QArrayData).alloc < (long)__n)) ||
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
    QByteArrayView::toByteArray((QByteArray *)&local_48,&local_28);
    pDVar1 = (this->d).d;
    pcVar4 = (this->d).ptr;
    (this->d).d = local_48.d;
    (this->d).ptr = local_48.ptr;
    qVar2 = (this->d).size;
    (this->d).size = local_48.size;
    local_48.d = pDVar1;
    local_48.ptr = pcVar4;
    local_48.size = qVar2;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  }
  else {
    pcVar4 = (this->d).ptr;
    pcVar3 = (char *)((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0);
    if (pcVar3 != pcVar4) {
      (this->d).ptr = pcVar3;
      pcVar4 = pcVar3;
    }
    memcpy(pcVar4,local_28.m_data,__n);
    (this->d).size = __n;
    (this->d).ptr[__n] = '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::assign(QByteArrayView v)
{
    const auto len = v.size();

    if (len <= capacity() &&  isDetached()) {
        const auto offset = d.freeSpaceAtBegin();
        if (offset)
            d.setBegin(d.begin() - offset);
        std::memcpy(d.begin(), v.data(), len);
        d.size = len;
        d.data()[d.size] = '\0';
    } else {
        *this = v.toByteArray();
    }
    return *this;
}